

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O1

vector2D<basisu::pvrtc4_block> * __thiscall
basisu::vector2D<basisu::pvrtc4_block>::operator=
          (vector2D<basisu::pvrtc4_block> *this,vector2D<basisu::pvrtc4_block> *other)

{
  TVec *this_00;
  pvrtc4_block *__src;
  
  if (this != other) {
    this->m_width = other->m_width;
    this->m_height = other->m_height;
    this_00 = &this->m_values;
    if ((this->m_values).m_capacity < (other->m_values).m_size) {
      if (this_00->m_p != (pvrtc4_block *)0x0) {
        free(this_00->m_p);
        this_00->m_p = (pvrtc4_block *)0x0;
        (this->m_values).m_size = 0;
        (this->m_values).m_capacity = 0;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,(other->m_values).m_size,false,8,(object_mover)0x0,
                 false);
    }
    else if ((this->m_values).m_size != 0) {
      (this->m_values).m_size = 0;
    }
    if ((this_00->m_p != (pvrtc4_block *)0x0) &&
       (__src = (other->m_values).m_p, __src != (pvrtc4_block *)0x0)) {
      memcpy(this_00->m_p,__src,(ulong)(other->m_values).m_size << 3);
    }
    (this->m_values).m_size = (other->m_values).m_size;
  }
  return this;
}

Assistant:

vector2D &operator= (const vector2D &other)
		{
			if (this != &other)
			{
				m_width = other.m_width;
				m_height = other.m_height;
				m_values = other.m_values;
			}
			return *this;
		}